

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void JS_ComputeMemoryUsage(JSRuntime *rt,JSMemoryUsage *s)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  list_head *plVar4;
  long lVar5;
  list_head *plVar6;
  JSShape **ppJVar7;
  JSAtomStruct **ppJVar8;
  size_t sVar9;
  int64_t iVar10;
  int64_t iVar11;
  byte bVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  list_head *plVar17;
  list_head *plVar18;
  JSShape *pJVar19;
  long lVar20;
  JSString *str;
  int64_t iVar21;
  int64_t iVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  bool bVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  JSMemoryUsage_helper local_78;
  JSRuntime *local_38;
  
  local_78.js_func_pc2line_count = 0;
  local_78.js_func_pc2line_size = 0;
  local_78.js_func_size = 0.0;
  local_78.js_func_code_size = 0;
  local_78.str_size = 0.0;
  local_78.js_func_count = 0;
  local_78.memory_used_count = 0.0;
  local_78.str_count = 0.0;
  memset(s,0,0xd0);
  s->malloc_count = (rt->malloc_state).malloc_count;
  sVar9 = (rt->malloc_state).malloc_limit;
  s->malloc_size = (rt->malloc_state).malloc_size;
  s->malloc_limit = sVar9;
  s->memory_used_count = 2;
  lVar13 = (long)rt->class_count * 0x10;
  s->memory_used_size = lVar13 + 400;
  plVar18 = (rt->context_list).next;
  local_38 = rt;
  if (plVar18 != &rt->context_list) {
    lVar16 = s->memory_used_size;
    iVar21 = s->memory_used_count;
    lVar20 = s->binary_object_count;
    lVar14 = s->binary_object_size;
    do {
      lVar16 = lVar16 + lVar13 + 0x1c0;
      plVar17 = plVar18[1].next;
      s->memory_used_count = iVar21 + 2;
      s->memory_used_size = lVar16;
      lVar20 = (ulong)*(ushort *)&plVar18[1].prev + lVar20;
      s->binary_object_count = lVar20;
      lVar14 = *(int *)((long)&plVar18[1].prev + 4) + lVar14;
      s->binary_object_size = lVar14;
      if ((plVar17 != (list_head *)0x0) && (*(char *)&plVar17[1].next == '\0')) {
        iVar24 = *(int *)&plVar17[2].prev;
        s->shape_count = s->shape_count + 1;
        s->shape_size =
             (long)(iVar24 + 1) * 4 + s->shape_size + (long)*(int *)((long)&plVar17[2].prev + 4) * 8
             + 0x40;
      }
      iVar21 = iVar21 + 2;
      for (plVar17 = plVar18[0x18].prev; plVar17 != (list_head *)&plVar18[0x17].next;
          plVar17 = plVar17->next) {
        lVar25 = iVar21 + 1;
        s->memory_used_count = lVar25;
        lVar16 = lVar16 + 0xa8;
        s->memory_used_size = lVar16;
        if (plVar17[1].prev != (list_head *)0x0) {
          lVar25 = iVar21 + 2;
          s->memory_used_count = lVar25;
          lVar16 = lVar16 + (long)*(int *)&plVar17[1].next * 0x10;
          s->memory_used_size = lVar16;
        }
        plVar4 = plVar17[2].prev;
        if (plVar4 != (list_head *)0x0) {
          lVar25 = lVar25 + 1;
          s->memory_used_count = lVar25;
          iVar24 = *(int *)&plVar17[2].next;
          lVar23 = (long)iVar24 * 0x20;
          lVar16 = lVar16 + lVar23;
          s->memory_used_size = lVar16;
          if (0 < (long)iVar24) {
            lVar15 = 0;
            do {
              if ((*(int *)((long)&plVar4[1].prev + lVar15) == 0) &&
                 (*(long *)((long)&plVar4->next + lVar15) != 0)) {
                lVar25 = lVar25 + 1;
                s->memory_used_count = lVar25;
                lVar5 = *(long *)((long)&plVar4->next + lVar15);
                if (*(int *)(lVar5 + 0x28) == -7) {
                  compute_jsstring_size(*(JSString **)(lVar5 + 0x20),&local_78);
                }
              }
              lVar15 = lVar15 + 0x20;
            } while (lVar23 != lVar15);
          }
        }
        if (plVar17[3].prev != (list_head *)0x0) {
          lVar25 = lVar25 + 1;
          s->memory_used_count = lVar25;
          lVar16 = lVar16 + (long)*(int *)&plVar17[3].next * 4;
          s->memory_used_size = lVar16;
        }
        if (plVar17[4].prev != (list_head *)0x0) {
          lVar25 = lVar25 + 1;
          s->memory_used_count = lVar25;
          lVar16 = lVar16 + (long)*(int *)&plVar17[4].next * 0xc;
          s->memory_used_size = lVar16;
        }
        if (*(int *)&plVar17[5].next == -7) {
          compute_jsstring_size((JSString *)plVar17[5].prev,&local_78);
        }
        if (*(int *)&plVar17[6].next == -7) {
          compute_jsstring_size((JSString *)plVar17[6].prev,&local_78);
        }
        iVar21 = lVar25;
      }
      plVar18 = plVar18->next;
    } while (plVar18 != &rt->context_list);
  }
  plVar18 = &local_38->gc_obj_list;
  plVar17 = (local_38->gc_obj_list).next;
  if (plVar17 != plVar18) {
    do {
      if (((ulong)plVar17[-1].next & 0xf00000000) == 0) {
        plVar4 = plVar17[1].prev;
        s->obj_count = s->obj_count + 1;
        plVar6 = plVar17[1].next;
        if (plVar6 != (list_head *)0x0) {
          s->memory_used_count = s->memory_used_count + 1;
          s->prop_size = s->prop_size + (long)*(int *)((long)&plVar4[2].prev + 4) * 0x10;
          lVar13 = (long)*(int *)&plVar4[2].next;
          s->prop_count = s->prop_count + lVar13;
          if (0 < lVar13) {
            lVar16 = 0;
            do {
              if (((*(int *)((long)&plVar4[4].prev + lVar16 + 4) != 0) &&
                  (*(uint *)((long)&plVar4[4].prev + lVar16) < 0x40000000)) &&
                 (*(int *)((long)&plVar6->next + lVar16 * 2) == -7)) {
                compute_jsstring_size(*(JSString **)((long)&plVar6->prev + lVar16 * 2),&local_78);
              }
              lVar16 = lVar16 + 8;
            } while (lVar13 * 8 != lVar16);
          }
        }
        if (*(char *)&plVar4[1].next == '\0') {
          iVar24 = *(int *)&plVar4[2].prev;
          s->shape_count = s->shape_count + 1;
          s->shape_size =
               (long)(iVar24 + 1) * 4 + s->shape_size +
               (long)*(int *)((long)&plVar4[2].prev + 4) * 8 + 0x40;
        }
        switch(*(undefined2 *)((long)&plVar17[-1].next + 6)) {
        case 2:
        case 8:
          s->array_count = s->array_count + 1;
          if ((((ulong)plVar17[-1].next & 0x80000000000) != 0) &&
             (s->fast_array_count = s->fast_array_count + 1, plVar17[3].prev != (list_head *)0x0)) {
            s->memory_used_count = s->memory_used_count + 1;
            s->memory_used_size = s->memory_used_size + (ulong)*(uint *)&plVar17[3].next * 0x10;
            s->fast_array_elements = s->fast_array_elements + (ulong)*(uint *)&plVar17[3].next;
            uVar3 = *(uint *)&plVar17[3].next;
            if ((ulong)uVar3 != 0) {
              plVar4 = plVar17[3].prev;
              lVar13 = 0;
              do {
                if (*(int *)((long)&plVar4->next + lVar13) == -7) {
                  compute_jsstring_size(*(JSString **)((long)&plVar4->prev + lVar13),&local_78);
                }
                lVar13 = lVar13 + 0x10;
              } while ((ulong)uVar3 << 4 != lVar13);
            }
          }
          break;
        default:
          if (plVar17[2].next != (list_head *)0x0) {
            s->memory_used_count = s->memory_used_count + 1;
          }
          break;
        case 4:
        case 5:
        case 6:
        case 7:
        case 10:
          str = (JSString *)plVar17[2].next;
          if (*(int *)&plVar17[3].prev == -7) goto LAB_0011c2c1;
          break;
        case 0xc:
          s->c_func_count = s->c_func_count + 1;
          break;
        case 0xd:
          plVar4 = plVar17[3].prev;
          if (plVar4 != (list_head *)0x0) {
            plVar6 = plVar17[2].next;
            s->memory_used_count = s->memory_used_count + 1;
            lVar13 = (long)*(int *)((long)&plVar6[5].next + 4);
            s->js_func_size = s->js_func_size + lVar13 * 8;
            if (0 < lVar13) {
              lVar16 = 0;
              do {
                plVar6 = (&plVar4->prev)[lVar16];
                if (plVar6 != (list_head *)0x0) {
                  iVar24 = *(int *)&plVar6->prev;
                  s->memory_used_count = (long)((double)s->memory_used_count + 1.0 / (double)iVar24)
                  ;
                  s->js_func_size = (long)((double)s->js_func_size + 48.0 / (double)iVar24);
                  if ((plVar6[1].next == plVar6 + 2) && (*(int *)&plVar6[2].next == -7)) {
                    compute_jsstring_size((JSString *)plVar6[2].prev,&local_78);
                  }
                }
                lVar16 = lVar16 + 1;
              } while (lVar13 != lVar16);
            }
          }
          break;
        case 0xe:
          plVar4 = plVar17[2].next;
          lVar13 = (long)*(int *)&plVar4[2].prev;
          if (0 < lVar13) {
            lVar16 = 0;
            do {
              if (*(int *)((long)&plVar4[3].prev + lVar16) == -7) {
                compute_jsstring_size(*(JSString **)((long)&plVar4[2].next + lVar16),&local_78);
              }
              lVar16 = lVar16 + 0x10;
            } while (lVar13 << 4 != lVar16);
          }
          s->memory_used_count = s->memory_used_count + 1;
          lVar13 = s->memory_used_size + lVar13 * 0x10 + 0x28;
LAB_0011c4d2:
          s->memory_used_size = lVar13;
          break;
        case 0xf:
          plVar4 = plVar17[2].next;
          if (plVar4 != (list_head *)0x0) {
            bVar12 = *(byte *)((long)&plVar4->next + 1);
            if (bVar12 != 0) {
              lVar13 = 0;
              do {
                if (*(int *)((long)&plVar4[1].next + lVar13) == -7) {
                  compute_jsstring_size(*(JSString **)((long)&plVar4[1].prev + lVar13),&local_78);
                }
                lVar13 = lVar13 + 0x10;
              } while ((ulong)bVar12 * 0x10 != lVar13);
            }
            s->memory_used_count = s->memory_used_count + 1;
            lVar13 = s->memory_used_size + (ulong)bVar12 * 0x10 + 0x10;
            goto LAB_0011c4d2;
          }
          break;
        case 0x11:
          plVar4 = plVar17[2].next;
          if (plVar4 != (list_head *)0x0) {
            if (*(int *)&plVar4->next == -7) {
              compute_jsstring_size((JSString *)plVar4->prev,&local_78);
            }
            s->memory_used_count = s->memory_used_count + 1;
            s->memory_used_size = s->memory_used_size + 0x20;
          }
          break;
        case 0x12:
          compute_jsstring_size((JSString *)plVar17[2].next,&local_78);
          str = (JSString *)plVar17[3].prev;
LAB_0011c2c1:
          compute_jsstring_size(str,&local_78);
          break;
        case 0x13:
        case 0x14:
          plVar4 = plVar17[2].next;
          if (plVar4 != (list_head *)0x0) {
            lVar13 = s->memory_used_count;
            s->memory_used_count = lVar13 + 1;
            lVar16 = s->memory_used_size + 0x30;
            s->memory_used_size = lVar16;
            if (plVar4->next != (list_head *)0x0) {
              s->memory_used_count = lVar13 + 2;
              s->memory_used_size = lVar16 + *(int *)&plVar4->prev;
            }
          }
        }
      }
      else if (((ulong)plVar17[-1].next & 0xf00000000) == 0x100000000) {
        if (plVar17[2].next == (list_head *)0x0) {
          iVar24 = 0x60;
        }
        else {
          iVar24 = ((uint)*(ushort *)((long)&plVar17[3].next + 2) +
                   (uint)*(ushort *)&plVar17[3].next) * 0x10 + 0x60;
        }
        plVar4 = plVar17[4].next;
        if (plVar4 != (list_head *)0x0) {
          iVar2 = *(int *)&plVar17[5].prev;
          iVar24 = iVar24 + iVar2 * 0x10;
          if (0 < (long)iVar2) {
            lVar13 = 0;
            do {
              if (*(int *)((long)&plVar4->next + lVar13) == -7) {
                compute_jsstring_size(*(JSString **)((long)&plVar4->prev + lVar13),&local_78);
              }
              lVar13 = lVar13 + 0x10;
            } while ((long)iVar2 * 0x10 != lVar13);
          }
        }
        if (plVar17[3].prev != (list_head *)0x0) {
          iVar24 = iVar24 + *(int *)((long)&plVar17[5].prev + 4) * 8;
        }
        uVar1 = *(ushort *)((long)&plVar17[1].prev + 1);
        if (((uVar1 >> 0xc & 1) == 0) && (plVar17[1].next != (list_head *)0x0)) {
          local_78.js_func_code_size = local_78.js_func_code_size + *(int *)&plVar17[2].prev;
        }
        bVar12 = 0;
        if ((uVar1 >> 10 & 1) != 0) {
          bVar26 = plVar17[7].prev == (list_head *)0x0;
          if (bVar26) {
            iVar24 = iVar24 + 0x20;
          }
          else {
            iVar24 = iVar24 + *(int *)&plVar17[6].prev + 0x21;
          }
          bVar12 = !bVar26;
          lVar13 = (long)*(int *)((long)&plVar17[6].prev + 4);
          if (lVar13 != 0) {
            bVar12 = bVar12 + 1;
            local_78.js_func_pc2line_count = local_78.js_func_pc2line_count + 1;
            local_78.js_func_pc2line_size = lVar13 + local_78.js_func_pc2line_size;
          }
        }
        local_78.js_func_size = (double)iVar24 + local_78.js_func_size;
        local_78.js_func_count = local_78.js_func_count + 1;
        local_78.memory_used_count = (double)bVar12 + local_78.memory_used_count;
      }
      plVar17 = plVar17->next;
    } while (plVar17 != plVar18);
  }
  lVar13 = s->memory_used_count;
  lVar16 = s->obj_count;
  lVar20 = lVar16 * 0x48 + s->obj_size;
  s->obj_size = lVar20;
  s->memory_used_count = lVar13 + 1;
  lVar14 = (long)local_38->shape_hash_size;
  lVar25 = lVar14 * 8 + s->memory_used_size;
  s->memory_used_size = lVar25;
  if (0 < lVar14) {
    ppJVar7 = local_38->shape_hash;
    lVar23 = 0;
    do {
      pJVar19 = ppJVar7[lVar23];
      if (pJVar19 != (JSShape *)0x0) {
        iVar21 = s->shape_count;
        iVar22 = s->shape_size;
        do {
          iVar21 = iVar21 + 1;
          iVar22 = iVar22 + (long)(int)(pJVar19->prop_hash_mask + 1) * 4 +
                   (long)pJVar19->prop_size * 8 + 0x40;
          pJVar19 = pJVar19->shape_hash_next;
        } while (pJVar19 != (JSShape *)0x0);
        s->shape_count = iVar21;
        s->shape_size = iVar22;
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 != lVar14);
  }
  lVar13 = lVar13 + 3;
  s->memory_used_count = lVar13;
  iVar24 = local_38->atom_count;
  s->atom_count = (long)iVar24;
  lVar14 = (long)local_38->atom_size;
  s->atom_size = lVar14 * 8 + (long)local_38->atom_hash_size * 4;
  if (0 < lVar14) {
    ppJVar8 = local_38->atom_array;
    lVar23 = 0;
    do {
      if (((ulong)ppJVar8[lVar23] & 1) == 0) {
        uVar3 = *(uint *)&ppJVar8[lVar23]->field_0x4;
        s->atom_size = (long)(int)((uVar3 & 0x7fffffff) << (byte)(uVar3 >> 0x1f)) +
                       (s->atom_size - (ulong)((int)uVar3 < 0)) + 0x11;
      }
      lVar23 = lVar23 + 1;
    } while (lVar14 != lVar23);
  }
  dVar27 = round(local_78.str_count);
  s->str_count = (long)dVar27;
  dVar28 = round(local_78.str_size);
  iVar21 = local_78.js_func_count;
  s->str_size = (long)dVar28;
  s->js_func_count = local_78.js_func_count;
  dVar29 = round(local_78.js_func_size);
  iVar11 = local_78.js_func_pc2line_size;
  iVar10 = local_78.js_func_pc2line_count;
  iVar22 = local_78.js_func_code_size;
  s->js_func_size = (long)dVar29;
  s->js_func_code_size = local_78.js_func_code_size;
  s->js_func_pc2line_count = local_78.js_func_pc2line_count;
  s->js_func_pc2line_size = local_78.js_func_pc2line_size;
  dVar30 = round(local_78.memory_used_count);
  s->memory_used_count =
       (long)((double)lVar13 +
             (double)iVar10 +
             (double)iVar21 +
             (double)s->shape_count +
             (double)lVar16 + (double)(long)dVar27 + (double)iVar24 + dVar30);
  s->memory_used_size =
       (long)dVar29 + iVar22 + lVar25 + lVar20 + (long)dVar28 + iVar11 + s->atom_size + s->prop_size
       + s->shape_size;
  return;
}

Assistant:

void JS_ComputeMemoryUsage(JSRuntime *rt, JSMemoryUsage *s)
{
    struct list_head *el, *el1;
    int i;
    JSMemoryUsage_helper mem = { 0 }, *hp = &mem;

    memset(s, 0, sizeof(*s));
    s->malloc_count = rt->malloc_state.malloc_count;
    s->malloc_size = rt->malloc_state.malloc_size;
    s->malloc_limit = rt->malloc_state.malloc_limit;

    s->memory_used_count = 2; /* rt + rt->class_array */
    s->memory_used_size = sizeof(JSRuntime) + sizeof(JSValue) * rt->class_count;

    list_for_each(el, &rt->context_list) {
        JSContext *ctx = list_entry(el, JSContext, link);
        JSShape *sh = ctx->array_shape;
        s->memory_used_count += 2; /* ctx + ctx->class_proto */
        s->memory_used_size += sizeof(JSContext) +
            sizeof(JSValue) * rt->class_count;
        s->binary_object_count += ctx->binary_object_count;
        s->binary_object_size += ctx->binary_object_size;

        /* the hashed shapes are counted separately */
        if (sh && !sh->is_hashed) {
            int hash_size = sh->prop_hash_mask + 1;
            s->shape_count++;
            s->shape_size += get_shape_size(hash_size, sh->prop_size);
        }
        list_for_each(el1, &ctx->loaded_modules) {
            JSModuleDef *m = list_entry(el1, JSModuleDef, link);
            s->memory_used_count += 1;
            s->memory_used_size += sizeof(*m);
            if (m->req_module_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->req_module_entries_count * sizeof(*m->req_module_entries);
            }
            if (m->export_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->export_entries_count * sizeof(*m->export_entries);
                for (i = 0; i < m->export_entries_count; i++) {
                    JSExportEntry *me = &m->export_entries[i];
                    if (me->export_type == JS_EXPORT_TYPE_LOCAL && me->u.local.var_ref) {
                        /* potential multiple count */
                        s->memory_used_count += 1;
                        compute_value_size(me->u.local.var_ref->value, hp);
                    }
                }
            }
            if (m->star_export_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->star_export_entries_count * sizeof(*m->star_export_entries);
            }
            if (m->import_entries) {
                s->memory_used_count += 1;
                s->memory_used_size += m->import_entries_count * sizeof(*m->import_entries);
            }
            compute_value_size(m->module_ns, hp);
            compute_value_size(m->func_obj, hp);
        }
    }

    list_for_each(el, &rt->gc_obj_list) {
        JSGCObjectHeader *gp = list_entry(el, JSGCObjectHeader, link);
        JSObject *p;
        JSShape *sh;
        JSShapeProperty *prs;

        /* XXX: could count the other GC object types too */
        if (gp->gc_obj_type == JS_GC_OBJ_TYPE_FUNCTION_BYTECODE) {
            compute_bytecode_size((JSFunctionBytecode *)gp, hp);
            continue;
        } else if (gp->gc_obj_type != JS_GC_OBJ_TYPE_JS_OBJECT) {
            continue;
        }
        p = (JSObject *)gp;
        sh = p->shape;
        s->obj_count++;
        if (p->prop) {
            s->memory_used_count++;
            s->prop_size += sh->prop_size * sizeof(*p->prop);
            s->prop_count += sh->prop_count;
            prs = get_shape_prop(sh);
            for(i = 0; i < sh->prop_count; i++) {
                JSProperty *pr = &p->prop[i];
                if (prs->atom != JS_ATOM_NULL && !(prs->flags & JS_PROP_TMASK)) {
                    compute_value_size(pr->u.value, hp);
                }
                prs++;
            }
        }
        /* the hashed shapes are counted separately */
        if (!sh->is_hashed) {
            int hash_size = sh->prop_hash_mask + 1;
            s->shape_count++;
            s->shape_size += get_shape_size(hash_size, sh->prop_size);
        }

        switch(p->class_id) {
        case JS_CLASS_ARRAY:             /* u.array | length */
        case JS_CLASS_ARGUMENTS:         /* u.array | length */
            s->array_count++;
            if (p->fast_array) {
                s->fast_array_count++;
                if (p->u.array.u.values) {
                    s->memory_used_count++;
                    s->memory_used_size += p->u.array.count *
                        sizeof(*p->u.array.u.values);
                    s->fast_array_elements += p->u.array.count;
                    for (i = 0; i < p->u.array.count; i++) {
                        compute_value_size(p->u.array.u.values[i], hp);
                    }
                }
            }
            break;
        case JS_CLASS_NUMBER:            /* u.object_data */
        case JS_CLASS_STRING:            /* u.object_data */
        case JS_CLASS_BOOLEAN:           /* u.object_data */
        case JS_CLASS_SYMBOL:            /* u.object_data */
        case JS_CLASS_DATE:              /* u.object_data */
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT:           /* u.object_data */
        case JS_CLASS_BIG_FLOAT:         /* u.object_data */
        case JS_CLASS_BIG_DECIMAL:         /* u.object_data */
#endif
            compute_value_size(p->u.object_data, hp);
            break;
        case JS_CLASS_C_FUNCTION:        /* u.cfunc */
            s->c_func_count++;
            break;
        case JS_CLASS_BYTECODE_FUNCTION: /* u.func */
            {
                JSFunctionBytecode *b = p->u.func.function_bytecode;
                JSVarRef **var_refs = p->u.func.var_refs;
                /* home_object: object will be accounted for in list scan */
                if (var_refs) {
                    s->memory_used_count++;
                    s->js_func_size += b->closure_var_count * sizeof(*var_refs);
                    for (i = 0; i < b->closure_var_count; i++) {
                        if (var_refs[i]) {
                            double ref_count = var_refs[i]->header.ref_count;
                            s->memory_used_count += 1 / ref_count;
                            s->js_func_size += sizeof(*var_refs[i]) / ref_count;
                            /* handle non object closed values */
                            if (var_refs[i]->pvalue == &var_refs[i]->value) {
                                /* potential multiple count */
                                compute_value_size(var_refs[i]->value, hp);
                            }
                        }
                    }
                }
            }
            break;
        case JS_CLASS_BOUND_FUNCTION:    /* u.bound_function */
            {
                JSBoundFunction *bf = p->u.bound_function;
                /* func_obj and this_val are objects */
                for (i = 0; i < bf->argc; i++) {
                    compute_value_size(bf->argv[i], hp);
                }
                s->memory_used_count += 1;
                s->memory_used_size += sizeof(*bf) + bf->argc * sizeof(*bf->argv);
            }
            break;
        case JS_CLASS_C_FUNCTION_DATA:   /* u.c_function_data_record */
            {
                JSCFunctionDataRecord *fd = p->u.c_function_data_record;
                if (fd) {
                    for (i = 0; i < fd->data_len; i++) {
                        compute_value_size(fd->data[i], hp);
                    }
                    s->memory_used_count += 1;
                    s->memory_used_size += sizeof(*fd) + fd->data_len * sizeof(*fd->data);
                }
            }
            break;
        case JS_CLASS_REGEXP:            /* u.regexp */
            compute_jsstring_size(p->u.regexp.pattern, hp);
            compute_jsstring_size(p->u.regexp.bytecode, hp);
            break;

        case JS_CLASS_FOR_IN_ITERATOR:   /* u.for_in_iterator */
            {
                JSForInIterator *it = p->u.for_in_iterator;
                if (it) {
                    compute_value_size(it->obj, hp);
                    s->memory_used_count += 1;
                    s->memory_used_size += sizeof(*it);
                }
            }
            break;
        case JS_CLASS_ARRAY_BUFFER:      /* u.array_buffer */
        case JS_CLASS_SHARED_ARRAY_BUFFER: /* u.array_buffer */
            {
                JSArrayBuffer *abuf = p->u.array_buffer;
                if (abuf) {
                    s->memory_used_count += 1;
                    s->memory_used_size += sizeof(*abuf);
                    if (abuf->data) {
                        s->memory_used_count += 1;
                        s->memory_used_size += abuf->byte_length;
                    }
                }
            }
            break;
        case JS_CLASS_GENERATOR:         /* u.generator_data */
        case JS_CLASS_UINT8C_ARRAY:      /* u.typed_array / u.array */
        case JS_CLASS_INT8_ARRAY:        /* u.typed_array / u.array */
        case JS_CLASS_UINT8_ARRAY:       /* u.typed_array / u.array */
        case JS_CLASS_INT16_ARRAY:       /* u.typed_array / u.array */
        case JS_CLASS_UINT16_ARRAY:      /* u.typed_array / u.array */
        case JS_CLASS_INT32_ARRAY:       /* u.typed_array / u.array */
        case JS_CLASS_UINT32_ARRAY:      /* u.typed_array / u.array */
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT64_ARRAY:   /* u.typed_array / u.array */
        case JS_CLASS_BIG_UINT64_ARRAY:  /* u.typed_array / u.array */
#endif
        case JS_CLASS_FLOAT32_ARRAY:     /* u.typed_array / u.array */
        case JS_CLASS_FLOAT64_ARRAY:     /* u.typed_array / u.array */
        case JS_CLASS_DATAVIEW:          /* u.typed_array */
#ifdef CONFIG_BIGNUM
        case JS_CLASS_FLOAT_ENV:         /* u.float_env */
#endif
        case JS_CLASS_MAP:               /* u.map_state */
        case JS_CLASS_SET:               /* u.map_state */
        case JS_CLASS_WEAKMAP:           /* u.map_state */
        case JS_CLASS_WEAKSET:           /* u.map_state */
        case JS_CLASS_MAP_ITERATOR:      /* u.map_iterator_data */
        case JS_CLASS_SET_ITERATOR:      /* u.map_iterator_data */
        case JS_CLASS_ARRAY_ITERATOR:    /* u.array_iterator_data */
        case JS_CLASS_STRING_ITERATOR:   /* u.array_iterator_data */
        case JS_CLASS_PROXY:             /* u.proxy_data */
        case JS_CLASS_PROMISE:           /* u.promise_data */
        case JS_CLASS_PROMISE_RESOLVE_FUNCTION:  /* u.promise_function_data */
        case JS_CLASS_PROMISE_REJECT_FUNCTION:   /* u.promise_function_data */
        case JS_CLASS_ASYNC_FUNCTION_RESOLVE:    /* u.async_function_data */
        case JS_CLASS_ASYNC_FUNCTION_REJECT:     /* u.async_function_data */
        case JS_CLASS_ASYNC_FROM_SYNC_ITERATOR:  /* u.async_from_sync_iterator_data */
        case JS_CLASS_ASYNC_GENERATOR:   /* u.async_generator_data */
            /* TODO */
        default:
            /* XXX: class definition should have an opaque block size */
            if (p->u.opaque) {
                s->memory_used_count += 1;
            }
            break;
        }
    }
    s->obj_size += s->obj_count * sizeof(JSObject);

    /* hashed shapes */
    s->memory_used_count++; /* rt->shape_hash */
    s->memory_used_size += sizeof(rt->shape_hash[0]) * rt->shape_hash_size;
    for(i = 0; i < rt->shape_hash_size; i++) {
        JSShape *sh;
        for(sh = rt->shape_hash[i]; sh != NULL; sh = sh->shape_hash_next) {
            int hash_size = sh->prop_hash_mask + 1;
            s->shape_count++;
            s->shape_size += get_shape_size(hash_size, sh->prop_size);
        }
    }

    /* atoms */
    s->memory_used_count += 2; /* rt->atom_array, rt->atom_hash */
    s->atom_count = rt->atom_count;
    s->atom_size = sizeof(rt->atom_array[0]) * rt->atom_size +
        sizeof(rt->atom_hash[0]) * rt->atom_hash_size;
    for(i = 0; i < rt->atom_size; i++) {
        JSAtomStruct *p = rt->atom_array[i];
        if (!atom_is_free(p)) {
            s->atom_size += (sizeof(*p) + (p->len << p->is_wide_char) +
                             1 - p->is_wide_char);
        }
    }
    s->str_count = round(mem.str_count);
    s->str_size = round(mem.str_size);
    s->js_func_count = mem.js_func_count;
    s->js_func_size = round(mem.js_func_size);
    s->js_func_code_size = mem.js_func_code_size;
    s->js_func_pc2line_count = mem.js_func_pc2line_count;
    s->js_func_pc2line_size = mem.js_func_pc2line_size;
    s->memory_used_count += round(mem.memory_used_count) +
        s->atom_count + s->str_count +
        s->obj_count + s->shape_count +
        s->js_func_count + s->js_func_pc2line_count;
    s->memory_used_size += s->atom_size + s->str_size +
        s->obj_size + s->prop_size + s->shape_size +
        s->js_func_size + s->js_func_code_size + s->js_func_pc2line_size;
}